

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# probe_method.cpp
# Opt level: O1

ostream * operator<<(ostream *out,RNG *rng)

{
  ostream *poVar1;
  Mark local_e0;
  Mark local_a0;
  Mark local_60;
  
  std::__ostream_insert<char,std::char_traits<char>>(out,"Generated ",10);
  poVar1 = std::ostream::_M_insert<long>((long)out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," numbers:\n",10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Total time = ",0xd);
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"ns\n",3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Average time = ",0xf);
  bm::Mark::average(&local_60,&rng->_generate_mark);
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"ns\n",3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Max time = ",0xb);
  bm::Mark::Mark<long,std::ratio<1l,1000000000l>>(&local_a0,&(rng->_generate_mark)._max);
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"ns\n",3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Min time = ",0xb);
  bm::Mark::Mark<long,std::ratio<1l,1000000000l>>
            (&local_e0,(duration<long,_std::ratio<1L,_1000000000L>_> *)rng);
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"ns\n",3);
  if (local_e0._overflow_callback.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_e0._overflow_callback.super__Function_base._M_manager)
              ((_Any_data *)&local_e0._overflow_callback,(_Any_data *)&local_e0._overflow_callback,
               __destroy_functor);
  }
  if (local_a0._overflow_callback.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_a0._overflow_callback.super__Function_base._M_manager)
              ((_Any_data *)&local_a0._overflow_callback,(_Any_data *)&local_a0._overflow_callback,
               __destroy_functor);
  }
  if (local_60._overflow_callback.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_60._overflow_callback.super__Function_base._M_manager)
              ((_Any_data *)&local_60._overflow_callback,(_Any_data *)&local_60._overflow_callback,
               __destroy_functor);
  }
  return out;
}

Assistant:

inline std::ostream& operator<<(std::ostream& out, RNG& rng)
{
    out << "Generated " << rng._generate_mark.iterations() << " numbers:\n"
        << "Total time = " << rng._generate_mark.as_nanoseconds() << "ns\n"
        << "Average time = " << rng._generate_mark.average().as_nanoseconds() << "ns\n"
        << "Max time = " << rng._generate_mark.maximal().as_nanoseconds() << "ns\n"
        << "Min time = " << rng._generate_mark.minimal().as_nanoseconds() << "ns\n";
    return out;
}